

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O3

void mocker::ir::printFunc(FunctionModule *func,ostream *out)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ostream *poVar2;
  pointer pbVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  shared_ptr<mocker::ir::IRInst> *extraout_RDX;
  shared_ptr<mocker::ir::IRInst> *extraout_RDX_00;
  shared_ptr<mocker::ir::IRInst> *extraout_RDX_01;
  shared_ptr<mocker::ir::IRInst> *extraout_RDX_02;
  shared_ptr<mocker::ir::IRInst> *extraout_RDX_03;
  shared_ptr<mocker::ir::IRInst> *inst;
  ulong uVar6;
  _List_node_base *p_Var7;
  long lVar8;
  _List_node_base *p_Var9;
  string attachedComment;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  long *local_98;
  long local_90;
  long local_88;
  undefined8 uStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  _List_node_base *local_38;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  std::__ostream_insert<char,std::char_traits<char>>(out,"define ",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(func->identifier)._M_dataplus._M_p,(func->identifier)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ( ",3);
  pbVar3 = (func->args).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((func->args).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar3) {
    lVar8 = 0;
    uVar6 = 0;
    do {
      if (uVar6 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
        pbVar3 = (pointer)((long)&(((func->args).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (out,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length);
      uVar6 = uVar6 + 1;
      pbVar3 = (func->args).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x20;
    } while (uVar6 < (ulong)((long)(func->args).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5));
  }
  std::__ostream_insert<char,std::char_traits<char>>(out," )",2);
  if (func->isExternal == true) {
    std::__ostream_insert<char,std::char_traits<char>>(out," external\n",10);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out," {\n",3);
    p_Var7 = (func->bbs).
             super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var7 != (_List_node_base *)&func->bbs) {
      local_38 = (_List_node_base *)&func->bbs;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,"<",1);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,">:\n",3);
        inst = extraout_RDX;
        for (p_Var9 = p_Var7[1]._M_prev; p_Var9 != (_List_node_base *)&p_Var7[1]._M_prev;
            p_Var9 = p_Var9->_M_next) {
          if (*(int *)&(p_Var9[1]._M_next)->_M_prev == 2) {
            this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var9[1]._M_prev;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this->_M_use_count = this->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this->_M_use_count = this->_M_use_count + 1;
              }
            }
            std::__cxx11::string::_M_assign((string *)&local_b8);
            inst = extraout_RDX_02;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
              inst = extraout_RDX_03;
            }
          }
          else {
            fmtInst_abi_cxx11_(&local_58,(ir *)(p_Var9 + 1),inst);
            if (local_b8._M_string_length == 0) {
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
            }
            else {
              std::operator+(&local_78,"  ; ",&local_b8);
            }
            uVar5 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              uVar5 = local_58.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar5 < local_78._M_string_length + local_58._M_string_length) {
              uVar5 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                uVar5 = local_78.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar5 < local_78._M_string_length + local_58._M_string_length)
              goto LAB_0019dc01;
              puVar4 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_78,0,(char *)0x0,(ulong)local_58._M_dataplus._M_p);
            }
            else {
LAB_0019dc01:
              puVar4 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
            }
            plVar1 = puVar4 + 2;
            if ((long *)*puVar4 == plVar1) {
              local_88 = *plVar1;
              uStack_80 = puVar4[3];
              local_98 = &local_88;
            }
            else {
              local_88 = *plVar1;
              local_98 = (long *)*puVar4;
            }
            local_90 = puVar4[1];
            *puVar4 = plVar1;
            puVar4[1] = 0;
            *(char *)plVar1 = '\0';
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            local_b8._M_string_length = 0;
            *local_b8._M_dataplus._M_p = '\0';
            if (local_90 == 0) {
              uVar5 = std::__throw_out_of_range_fmt
                                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,0,0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,
                                CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                         local_b8.field_2._M_local_buf[0]) + 1);
              }
              _Unwind_Resume(uVar5);
            }
            if ((char)*local_98 != ';') {
              std::__ostream_insert<char,std::char_traits<char>>(out,"  ",2);
            }
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               (out,(char *)local_98,local_90);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
            inst = extraout_RDX_00;
            if (local_98 != &local_88) {
              operator_delete(local_98,local_88 + 1);
              inst = extraout_RDX_01;
            }
          }
        }
        p_Var7 = p_Var7->_M_next;
      } while (p_Var7 != local_38);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
    std::ostream::put((char)out);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void printFunc(const FunctionModule &func, std::ostream &out) {
  std::string attachedComment;

  out << "define " << func.getIdentifier() << " ( ";
  for (std::size_t i = 0; i < func.getArgs().size(); ++i) {
    if (i != 0)
      out << " ";
    out << func.getArgs()[i];
  }
  out << " )";
  if (func.isExternalFunc()) {
    out << " external\n";
    return;
  }
  out << " {\n";
  for (const auto &bb : func.getBBs()) {
    out << "<" << bb.getLabelID() << ">:\n";
    for (const auto &inst : bb.getInsts()) {
      if (auto p = dyc<AttachedComment>(inst)) {
        attachedComment = p->getContent();
        continue;
      }

      auto str = fmtInst(inst) +
                 (attachedComment.empty() ? "" : "  ; " + attachedComment);
      attachedComment.clear();
      if (str.at(0) != ';')
        out << "  ";
      out << str << "\n";
    }
  }
  out << "}" << std::endl;
}